

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void __thiscall EthBasePort::WaitBroadcastRead(EthBasePort *this)

{
  double dVar1;
  double dVar2;
  
  dVar2 = (double)((this->super_BasePort).NumOfBoards_ - 1);
  if (this->useFwBridge == false) {
    dVar2 = dVar2 * 38.0 + 3.0;
  }
  else {
    dVar2 = dVar2 * 10.0 + 10.0;
  }
  dVar1 = ((this->super_BasePort).bcReadInfo.updateFinishTime -
          (this->super_BasePort).bcReadInfo.updateStartTime) * 1000000.0;
  if (dVar1 <= dVar2) {
    dVar1 = dVar2;
  }
  Amp1394_Sleep(dVar1 * 1e-06);
  return;
}

Assistant:

void EthBasePort::WaitBroadcastRead(void)
{
    // Wait for all boards to respond with data
    // Ethernet/Firewire bridge: 10 + 10 * (Nb-1) us, where Nb is number of boards used in this configuration
    // Ethernet-only: 3 + 38 * (Nb-1) us, based on measurements, assuming contiguous Ethernet chain
    // Note that for Ethernet-only, it is not necessary to wait because the FPGA sends the broadcast read
    // response packet when all data is ready. Thus, the only advantage to waiting here is that we avoid
    // possible timeouts when receiving the response packet.
    double waitTime_uS = useFwBridge ? (10.0 + 10.0*(NumOfBoards_-1)) : (3.0 + 38.0*(NumOfBoards_-1));
    // Check the most recent measured update time, and use that if it is longer than
    // the computed waitTime_uS.
    double bcUpdateTime_uS = (bcReadInfo.updateFinishTime-bcReadInfo.updateStartTime)*1e6;
    if (bcUpdateTime_uS > waitTime_uS)
        waitTime_uS = bcUpdateTime_uS;
    Amp1394_Sleep(waitTime_uS*1e-6);
}